

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCallIds_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this)

{
  DeferCommands *pDVar1;
  pointer pDVar2;
  long lVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pDVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 != (DeferCommands *)0x0) {
    pDVar2 = *(pointer *)
              ((long)&(pDVar1->Commands).
                      super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
              + 8);
    for (pDVar6 = *(pointer *)
                   &(pDVar1->Commands).
                    super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
        ; (pDVar6 != pDVar2 && ((pDVar6->Id)._M_string_length == 0)); pDVar6 = pDVar6 + 1) {
    }
    if (pDVar6 == pDVar2) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,cmList::element_separator._M_str,
                 cmList::element_separator._M_str + cmList::element_separator._M_len);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      lVar3 = *(long *)&(pDVar6->Id)._M_dataplus;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar3,(pDVar6->Id)._M_string_length + lVar3);
      do {
        pDVar5 = pDVar6 + 1;
        if (pDVar5 == pDVar2) break;
        pDVar4 = pDVar6 + 1;
        pDVar6 = pDVar5;
      } while ((pDVar4->Id)._M_string_length == 0);
      if (pDVar5 != pDVar2) {
        do {
          std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
          std::__cxx11::string::_M_append((char *)&local_70,*(ulong *)&(pDVar5->Id)._M_dataplus);
          pDVar6 = pDVar5;
          do {
            pDVar5 = pDVar6 + 1;
            if (pDVar5 == pDVar2) break;
            pDVar4 = pDVar6 + 1;
            pDVar6 = pDVar5;
          } while ((pDVar4->Id)._M_string_length == 0);
        } while (pDVar5 != pDVar2);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCallIds() const
{
  cm::optional<std::string> ids;
  if (this->Defer) {
    ids = cmList::to_string(
      cmMakeRange(this->Defer->Commands)
        .filter([](DeferCommand const& dc) -> bool { return !dc.Id.empty(); })
        .transform(
          [](DeferCommand const& dc) -> std::string const& { return dc.Id; }));
  }
  return ids;
}